

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O2

void __thiscall helics::DependencyInfo::DependencyInfo(DependencyInfo *this,GlobalFederateId id)

{
  TimeData::TimeData(&this->super_TimeData);
  (this->fedID).gid = id.gid;
  this->cyclic = false;
  this->connection = INDEPENDENT;
  this->dependent = false;
  this->dependency = false;
  this->forwarding = id.gid == 1 || 0x6fffffff < id.gid;
  this->nonGranting = false;
  this->triggered = false;
  this->updateRequested = false;
  return;
}

Assistant:

explicit DependencyInfo(GlobalFederateId id): fedID(id), forwarding{id.isBroker()} {}